

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

bool Imath_3_2::extractSHRT<float>
               (Matrix44<float> *mat,Vec3<float> *s,Vec3<float> *h,Vec3<float> *r,Vec3<float> *t,
               bool exc,Order rOrder)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  Euler<float> e;
  int m [3];
  Euler<float> local_ac;
  Matrix33<float> local_9c;
  Euler<float> local_78;
  Matrix44<float> local_68;
  
  uVar3 = *(undefined8 *)mat->x[0];
  uVar4 = *(undefined8 *)(mat->x[0] + 2);
  local_68.x[0][0] = (float)uVar3;
  local_68.x[0][1] = (float)((ulong)uVar3 >> 0x20);
  local_68.x[0][2] = (float)uVar4;
  local_68.x[0][3] = (float)((ulong)uVar4 >> 0x20);
  uVar3 = *(undefined8 *)mat->x[1];
  local_68.x[1]._8_8_ = *(undefined8 *)(mat->x[1] + 2);
  local_68.x[1][0] = (float)uVar3;
  local_68.x[1][1] = (float)((ulong)uVar3 >> 0x20);
  local_68.x[2]._0_8_ = *(undefined8 *)mat->x[2];
  uVar3 = *(undefined8 *)(mat->x[2] + 2);
  local_68.x[2][2] = (float)uVar3;
  local_68.x[2][3] = (float)((ulong)uVar3 >> 0x20);
  uVar3 = *(undefined8 *)mat->x[3];
  uVar4 = *(undefined8 *)(mat->x[3] + 2);
  local_68.x[3][0] = (float)uVar3;
  local_68.x[3][1] = (float)((ulong)uVar3 >> 0x20);
  local_68.x[3][2] = (float)uVar4;
  local_68.x[3][3] = (float)((ulong)uVar4 >> 0x20);
  bVar5 = extractAndRemoveScalingAndShear<float>(&local_68,s,h,exc);
  if (bVar5) {
    extractEulerXYZ<float>(&local_68,r);
    t->x = mat->x[3][0];
    t->y = mat->x[3][1];
    t->z = mat->x[3][2];
    if (rOrder != Default) {
      local_78._12_1_ = local_78._12_1_ & 0xe0 | 5;
      local_78.super_Vec3<float>.x = r->x;
      local_78.super_Vec3<float>.y = r->y;
      local_78.super_Vec3<float>.z = r->z;
      bVar7 = 0x10;
      if ((rOrder >> 0xd & 1) == 0) {
        bVar7 = (byte)(rOrder >> 9) & 8;
      }
      local_ac._12_1_ =
           (byte)rOrder >> 3 & 2 | (byte)(rOrder >> 6) & 4 | (byte)rOrder & 1 | bVar7 |
           local_ac._12_1_ & 0xe0;
      Euler<float>::toMatrix33(&local_9c,&local_78);
      Euler<float>::extract(&local_ac,&local_9c);
      uVar6 = (byte)local_ac._12_1_ >> 3 & 3;
      local_9c.x[0][uVar6] = 0.0;
      bVar8 = (local_ac._12_1_ & 4) == 0;
      local_9c.x[0][(byte)((char)(uVar6 + 1) + (char)((uVar6 + 1) * 0x56 >> 8) * -3)] =
           (float)(bVar8 + 1);
      local_9c.x[0][(byte)((char)(uVar6 + 2) + (char)((uVar6 + 2) * 0x56 >> 8) * -3)] =
           (float)(2 - (uint)bVar8);
      fVar1 = (&local_ac.super_Vec3<float>.x)[(int)local_9c.x[0][1]];
      fVar2 = (&local_ac.super_Vec3<float>.x)[(int)local_9c.x[0][2]];
      r->x = (&local_ac.super_Vec3<float>.x)[(int)local_9c.x[0][0]];
      r->y = fVar1;
      r->z = fVar2;
    }
  }
  return bVar5;
}

Assistant:

bool
extractSHRT (
    const Matrix44<T>&       mat,
    Vec3<T>&                 s,
    Vec3<T>&                 h,
    Vec3<T>&                 r,
    Vec3<T>&                 t,
    bool                     exc /* = true */,
    typename Euler<T>::Order rOrder /* = Euler<T>::XYZ */)
{
    Matrix44<T> rot;

    rot = mat;
    if (!extractAndRemoveScalingAndShear (rot, s, h, exc)) return false;

    extractEulerXYZ (rot, r);

    t.x = mat[3][0];
    t.y = mat[3][1];
    t.z = mat[3][2];

    if (rOrder != Euler<T>::XYZ)
    {
        Euler<T> eXYZ (r, Euler<T>::XYZ);
        Euler<T> e (eXYZ, rOrder);
        r = e.toXYZVector ();
    }

    return true;
}